

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

UA_StatusCode
UA_Server_addDataSourceVariableNode
          (UA_Server *server,UA_NodeId requestedNewNodeId,UA_NodeId parentNodeId,
          UA_NodeId referenceTypeId,UA_QualifiedName browseName,UA_NodeId typeDefinition,
          UA_VariableAttributes attr,UA_DataSource dataSource,UA_NodeId *outNewNodeId)

{
  UA_QualifiedName UVar1;
  UA_StatusCode UVar2;
  UA_VariableNode *vnode;
  undefined1 local_270 [8];
  UA_AddNodesResult result;
  UA_AddNodesItem item;
  UA_DataValue value;
  UA_VariableAttributes editAttr;
  UA_StatusCode retval;
  UA_VariableNode *node;
  UA_NodeId *outNewNodeId_local;
  UA_Server *server_local;
  
  UVar1 = browseName;
  vnode = (UA_VariableNode *)UA_NodeStore_newNode(UA_NODECLASS_VARIABLE);
  if (vnode == (UA_VariableNode *)0x0) {
    server_local._4_4_ = 0x80030000;
  }
  else {
    editAttr._196_4_ = 0;
    memcpy(&value.serverPicoseconds,&attr,200);
    UA_DataValue_init((UA_DataValue *)&item.typeDefinition.serverIndex);
    if (dataSource.read ==
        (_func_UA_StatusCode_void_ptr_UA_NodeId_UA_Boolean_UA_NumericRange_ptr_UA_DataValue_ptr *)
        0x0) {
      editAttr._196_4_ = 0x80740000;
    }
    else {
      editAttr._196_4_ =
           (*dataSource.read)(dataSource.handle,requestedNewNodeId,false,(UA_NumericRange *)0x0,
                              (UA_DataValue *)&item.typeDefinition.serverIndex);
    }
    memcpy(&editAttr.writeMask,&value,0x30);
    if (editAttr._196_4_ == 0) {
      UA_AddNodesItem_init((UA_AddNodesItem *)((long)&result.addedNodeId.identifier + 8));
      item.referenceTypeId.identifier.string.data = (UA_Byte *)requestedNewNodeId._0_8_;
      item.requestedNewNodeId.nodeId._0_8_ = requestedNewNodeId.identifier.string.length;
      item.requestedNewNodeId.nodeId.identifier.string.length =
           (size_t)requestedNewNodeId.identifier.string.data;
      item.requestedNewNodeId.serverIndex._0_2_ = browseName.namespaceIndex;
      item.requestedNewNodeId._42_6_ = browseName._2_6_;
      browseName.name.length = UVar1.name.length;
      item.browseName._0_8_ = browseName.name.length;
      browseName.name.data = UVar1.name.data;
      item.browseName.name.length = (size_t)browseName.name.data;
      item.nodeAttributes.content.encoded.body.data = (UA_Byte *)typeDefinition._0_8_;
      item.typeDefinition.nodeId._0_8_ = typeDefinition.identifier.string.length;
      item.typeDefinition.nodeId.identifier.string.length =
           (size_t)typeDefinition.identifier.string.data;
      result.addedNodeId.identifier.string.data = (UA_Byte *)parentNodeId._0_8_;
      item.parentNodeId.nodeId._0_8_ = parentNodeId.identifier.string.length;
      item.parentNodeId.nodeId.identifier.string.length =
           (size_t)parentNodeId.identifier.string.data;
      UVar2 = copyStandardAttributes
                        ((UA_Node *)vnode,
                         (UA_AddNodesItem *)((long)&result.addedNodeId.identifier + 8),
                         (UA_NodeAttributes *)&value.serverPicoseconds);
      editAttr._196_4_ = UVar2 | editAttr._196_4_;
      UVar2 = copyVariableNodeAttributes
                        (server,vnode,(UA_AddNodesItem *)((long)&result.addedNodeId.identifier + 8),
                         (UA_VariableAttributes *)&value.serverPicoseconds);
      editAttr._196_4_ = UVar2 | editAttr._196_4_;
      UA_DataValue_deleteMembers(&(vnode->value).data.value);
      vnode->valueSource = UA_VALUESOURCE_DATASOURCE;
      (vnode->value).dataSource.handle = dataSource.handle;
      (vnode->value).dataSource.read = dataSource.read;
      (vnode->value).dataSource.write = dataSource.write;
      UA_DataValue_deleteMembers((UA_DataValue *)&item.typeDefinition.serverIndex);
      if (editAttr._196_4_ == 0) {
        UA_AddNodesResult_init((UA_AddNodesResult *)local_270);
        server_local._4_4_ =
             Service_AddNodes_existing
                       (server,&adminSession,(UA_Node *)vnode,&parentNodeId,&referenceTypeId,
                        &typeDefinition,(UA_InstantiationCallback *)0x0,outNewNodeId);
      }
      else {
        UA_NodeStore_deleteNode((UA_Node *)vnode);
        server_local._4_4_ = editAttr._196_4_;
      }
    }
    else {
      UA_NodeStore_deleteNode((UA_Node *)vnode);
      server_local._4_4_ = editAttr._196_4_;
    }
  }
  return server_local._4_4_;
}

Assistant:

UA_StatusCode
UA_Server_addDataSourceVariableNode(UA_Server *server, const UA_NodeId requestedNewNodeId,
                                    const UA_NodeId parentNodeId, const UA_NodeId referenceTypeId,
                                    const UA_QualifiedName browseName, const UA_NodeId typeDefinition,
                                    const UA_VariableAttributes attr, const UA_DataSource dataSource,
                                    UA_NodeId *outNewNodeId) {
    /* Create the new node */
    UA_VariableNode *node = UA_NodeStore_newVariableNode();
    if(!node)
        return UA_STATUSCODE_BADOUTOFMEMORY;

    /* Read the current value (to do typechecking) */
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    UA_VariableAttributes editAttr = attr;
    UA_DataValue value;
    UA_DataValue_init(&value);
    if(dataSource.read)
        retval = dataSource.read(dataSource.handle, requestedNewNodeId,
                                 false, NULL, &value);
    else
        retval = UA_STATUSCODE_BADTYPEMISMATCH;
    editAttr.value = value.value;

    if(retval != UA_STATUSCODE_GOOD) {
        UA_NodeStore_deleteNode((UA_Node*)node);
        return retval;
    }

    /* Copy attributes into node */
    UA_RCU_LOCK();
    UA_AddNodesItem item;
    UA_AddNodesItem_init(&item);
    item.requestedNewNodeId.nodeId = requestedNewNodeId;
    item.browseName = browseName;
    item.typeDefinition.nodeId = typeDefinition;
    item.parentNodeId.nodeId = parentNodeId;
    retval |= copyStandardAttributes((UA_Node*)node, &item, (const UA_NodeAttributes*)&editAttr);
    retval |= copyVariableNodeAttributes(server, node, &item, &editAttr);
    UA_DataValue_deleteMembers(&node->value.data.value);
    node->valueSource = UA_VALUESOURCE_DATASOURCE;
    node->value.dataSource = dataSource;
    UA_DataValue_deleteMembers(&value);
    if(retval != UA_STATUSCODE_GOOD) {
        UA_NodeStore_deleteNode((UA_Node*)node);
        UA_RCU_UNLOCK();
        return retval;
    }

    /* Add the node */
    UA_AddNodesResult result;
    UA_AddNodesResult_init(&result);
    retval = Service_AddNodes_existing(server, &adminSession, (UA_Node*)node, &parentNodeId,
                                       &referenceTypeId, &typeDefinition, NULL, outNewNodeId);
    UA_RCU_UNLOCK();
    return retval;
}